

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgIndexSets.cpp
# Opt level: O2

void __thiscall
TasGrid::MultiIndexSet::removeIndex(MultiIndexSet *this,vector<int,_std::allocator<int>_> *p)

{
  uint uVar1;
  const_iterator __first;
  
  uVar1 = getSlot(this,p);
  if (-1 < (int)uVar1) {
    __first._M_current =
         (this->indexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_start + (ulong)uVar1 * this->num_dimensions;
    ::std::vector<int,_std::allocator<int>_>::erase
              (&this->indexes,__first,(const_iterator)(__first._M_current + this->num_dimensions));
    this->cache_num_indexes = this->cache_num_indexes + -1;
  }
  return;
}

Assistant:

void MultiIndexSet::removeIndex(const std::vector<int> &p){
    int slot = getSlot(p);
    if (slot > -1){
        indexes.erase(indexes.begin() + static_cast<size_t>(slot) * num_dimensions, indexes.begin() + static_cast<size_t>(slot) * num_dimensions + num_dimensions);
        cache_num_indexes--;
    }
}